

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::VarExtend::add_source(VarExtend *this,shared_ptr<kratos::AssignStmt> *param_1)

{
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  initializer_list<kratos::IRNode_*> __l;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  string local_90;
  pointer local_70;
  pointer ppIStack_68;
  Var *local_50;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  allocator_type local_21;
  
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_70);
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = local_70;
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppIStack_68;
  bVar1 = fmt::v7::to_string_view<char,_0>("Cannot add source to an extended variable ({0})");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar1.data_,format_str,args);
  local_50 = this->parent_;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_21);
  StmtException::StmtException(this_00,&local_90,&local_48);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VarExtend::add_source(const std::shared_ptr<AssignStmt> &) {
    throw StmtException(
        ::format("Cannot add source to an extended variable ({0})", parent_->to_string()),
        {parent_});
}